

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O1

void duckdb::TemplatedFillLoop<unsigned_short>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var6;
  sel_t *psVar7;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  UnifiedVectorFormat vdata;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (vector->vector_type == CONSTANT_VECTOR) {
    pdVar3 = vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
      if (count != 0) {
        psVar7 = sel->sel_vector;
        uVar15 = 0;
        do {
          uVar13 = uVar15;
          if (psVar7 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar7[uVar15];
          }
          *(undefined2 *)(pdVar2 + uVar13 * 2) = *(undefined2 *)pdVar3;
          uVar15 = uVar15 + 1;
        } while (count != uVar15);
      }
    }
    else if (count != 0) {
      uVar15 = 0;
      do {
        uVar13 = uVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)sel->sel_vector[uVar15];
        }
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_98 = (element_type *)
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,(unsigned_long *)&local_98);
          pdVar2 = local_78.data;
          pSVar11 = local_78.sel;
          local_78.sel = (SelectionVector *)0x0;
          local_78.data = (data_ptr_t)0x0;
          p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar11;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar2;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar13 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar13 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(ulong)count,&local_78);
    if (count != 0) {
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar15 = 0;
      do {
        _Var6._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        uVar13 = uVar15;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var6._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar13 = (ulong)*(uint *)((long)_Var6._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar15 * 4);
        }
        uVar14 = uVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)sel->sel_vector[uVar15];
        }
        *(undefined2 *)(pdVar2 + uVar14 * 2) =
             *(undefined2 *)((long)(_func_int ***)local_78.data + uVar13 * 2);
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar13 >> 6]
             >> (uVar13 & 0x3f) & 1) != 0)) {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 != (unsigned_long *)0x0) {
            puVar1 = puVar4 + (uVar14 >> 6);
            *puVar1 = *puVar1 | 1L << ((byte)uVar14 & 0x3f);
          }
        }
        else {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var10 = p_Stack_90;
            peVar9 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar8 = (byte)uVar14 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar14 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}